

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ValueRangeExpression::fromSyntax
          (Compilation *comp,ValueRangeExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  undefined1 uVar2;
  Diagnostic *diag_00;
  ValueRangeExpression *pVVar3;
  Expression *pEVar4;
  SVInt *pSVar5;
  Compilation *compilation;
  Expression *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  Diagnostic *diag_1;
  ConstantValue cvr;
  ConstantValue cvl;
  Expression *in_stack_00000160;
  ASTContext *in_stack_00000168;
  Diagnostic *diag;
  not_null<const_slang::ast::Type_*> rt;
  not_null<const_slang::ast::Type_*> lt;
  ValueRangeExpression *result;
  Expression *right;
  Expression *left;
  ASTFlags flags;
  ValueRangeKind rangeKind;
  Expression *in_stack_fffffffffffffdb8;
  Compilation *in_stack_fffffffffffffdc0;
  SVInt *in_stack_fffffffffffffdc8;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  SourceLocation in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  DiagCode in_stack_fffffffffffffde4;
  undefined5 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  ValueRangeKind *in_stack_fffffffffffffdf0;
  DiagCode code;
  Type *in_stack_fffffffffffffdf8;
  BumpAllocator *in_stack_fffffffffffffe00;
  Type *local_b0;
  not_null<const_slang::ast::Type_*> local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  undefined4 local_8c;
  Type *in_stack_ffffffffffffff78;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffff80;
  ExpressionSyntax *in_stack_ffffffffffffff88;
  Compilation *in_stack_ffffffffffffff90;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff98;
  bitmask<slang::ast::ASTFlags> local_50;
  Expression *local_48;
  bitmask<slang::ast::ASTFlags> local_40;
  Expression *local_38;
  ASTFlags local_30;
  int local_24;
  Expression *local_20;
  long local_18;
  Compilation *local_10;
  
  if (*(short *)(in_RSI + 0x30) == 0x21) {
    local_24 = 1;
  }
  else if (*(short *)(in_RSI + 0x30) == 0x22) {
    local_24 = 2;
  }
  else {
    local_24 = 0;
  }
  local_30 = None;
  if (local_24 == 0) {
    local_30 = AllowUnboundedLiteral;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  diag_00 = (Diagnostic *)
            not_null<slang::syntax::ExpressionSyntax_*>::operator*
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa4867b);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,local_30);
  local_38 = Expression::create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                (ASTContext *)in_stack_ffffffffffffff80.ptr,
                                in_stack_ffffffffffffff98,in_stack_ffffffffffffff78);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa486e9);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,local_30);
  local_48 = Expression::create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                (ASTContext *)in_stack_ffffffffffffff80.ptr,
                                in_stack_ffffffffffffff98,in_stack_ffffffffffffff78);
  Compilation::getVoidType(local_10);
  pEVar4 = local_38;
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag_00);
  pVVar3 = BumpAllocator::
           emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                      (Expression *)
                      CONCAT17(in_stack_fffffffffffffdef,
                               CONCAT16(in_stack_fffffffffffffdee,
                                        CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8
                                                ))),
                      (Expression *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      (SourceRange *)in_stack_fffffffffffffdd8);
  code = SUB84((ulong)in_stack_fffffffffffffdf0 >> 0x20,0);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffdc0);
  if ((bVar1) || (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffdc0), bVar1)) {
    pEVar4 = Expression::badExpr(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    return pEVar4;
  }
  not_null<const_slang::ast::Type_*>::not_null<slang::not_null<const_slang::ast::Type_*>_&>
            ((not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffdc0,
             (not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffdb8);
  not_null<const_slang::ast::Type_*>::not_null<slang::not_null<const_slang::ast::Type_*>_&>
            ((not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffdc0,
             (not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffdb8);
  if (local_24 != 0) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa48cb9);
    bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffdc0);
    if (bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa48cd4)
      ;
      bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffdc0);
      if (bVar1) {
        Expression::selfDetermined((ASTContext *)diag_00,(Expression **)in_RDI);
        return &pVVar3->super_Expression;
      }
    }
    parsing::Token::location((Token *)(local_18 + 0x30));
    ASTContext::addDiag((ASTContext *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
                        in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
    range_01.endLoc._0_6_ = in_stack_fffffffffffffdd0;
    range_01.startLoc = (SourceLocation)in_stack_fffffffffffffdc8;
    range_01.endLoc._6_1_ = in_stack_fffffffffffffdd6;
    range_01.endLoc._7_1_ = in_stack_fffffffffffffdd7;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdc0,range_01);
    range_02.endLoc._0_6_ = in_stack_fffffffffffffdd0;
    range_02.startLoc = (SourceLocation)in_stack_fffffffffffffdc8;
    range_02.endLoc._6_1_ = in_stack_fffffffffffffdd6;
    range_02.endLoc._7_1_ = in_stack_fffffffffffffdd7;
    compilation = (Compilation *)
                  Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdc0,range_02);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa48dbd);
    ast::operator<<(diag_00,(Type *)in_RDI);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa48ddc);
    ast::operator<<(diag_00,(Type *)in_RDI);
    pEVar4 = Expression::badExpr(compilation,local_20);
    return pEVar4;
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa4886b);
  bVar1 = Type::isUnbounded((Type *)0xa48873);
  if (bVar1) {
    Compilation::getIntType(local_10);
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
              ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffff80,
               (Type **)&stack0xffffffffffffff78);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa488c3);
    bVar1 = Type::isUnbounded((Type *)0xa488cb);
    if (bVar1) {
      local_8c = 0xa90007;
      local_a0 = (pVVar3->super_Expression).sourceRange.startLoc;
      local_98 = (pVVar3->super_Expression).sourceRange.endLoc;
      sourceRange.startLoc._4_2_ = in_stack_fffffffffffffde4.subsystem;
      sourceRange.startLoc._6_2_ = in_stack_fffffffffffffde4.code;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffde0;
      sourceRange.endLoc._0_5_ = in_stack_fffffffffffffde8;
      sourceRange.endLoc._5_1_ = in_stack_fffffffffffffded;
      sourceRange.endLoc._6_1_ = in_stack_fffffffffffffdee;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffffdef;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffdd8,code,sourceRange);
    }
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa48931);
  bVar1 = Type::isUnbounded((Type *)0xa48939);
  if (bVar1) {
    local_b0 = Compilation::getIntType(local_10);
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_a8,&local_b0);
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa48986);
  bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffdc0);
  if (bVar1) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa489a1);
    bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffdc0);
    if (bVar1) goto LAB_00a48b02;
  }
  bVar1 = Expression::isImplicitString(pEVar4);
  if ((!bVar1) || (bVar1 = Expression::isImplicitString(pEVar4), !bVar1)) {
    parsing::Token::location((Token *)(local_18 + 0x30));
    ASTContext::addDiag((ASTContext *)
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
                        in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
    range.endLoc._0_6_ = in_stack_fffffffffffffdd0;
    range.startLoc = (SourceLocation)in_stack_fffffffffffffdc8;
    range.endLoc._6_1_ = in_stack_fffffffffffffdd6;
    range.endLoc._7_1_ = in_stack_fffffffffffffdd7;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdc0,range);
    range_00.endLoc._0_6_ = in_stack_fffffffffffffdd0;
    range_00.startLoc = (SourceLocation)in_stack_fffffffffffffdc8;
    range_00.endLoc._6_1_ = in_stack_fffffffffffffdd6;
    range_00.endLoc._7_1_ = in_stack_fffffffffffffdd7;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdc0,range_00);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa48ab4);
    ast::operator<<(diag_00,(Type *)in_RDI);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa48ad3);
    ast::operator<<(diag_00,(Type *)in_RDI);
    pEVar4 = Expression::badExpr(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    return pEVar4;
  }
LAB_00a48b02:
  ASTContext::tryEval(in_stack_00000168,in_stack_00000160);
  ASTContext::tryEval(in_stack_00000168,in_stack_00000160);
  uVar2 = slang::ConstantValue::isInteger((ConstantValue *)0xa48b4b);
  bVar1 = false;
  if ((bool)uVar2) {
    in_stack_fffffffffffffded = slang::ConstantValue::isInteger((ConstantValue *)0xa48b72);
    bVar1 = false;
    if ((bool)in_stack_fffffffffffffded) {
      pSVar5 = slang::ConstantValue::integer((ConstantValue *)0xa48b96);
      in_stack_fffffffffffffde0 = SUB84(pSVar5,0);
      in_stack_fffffffffffffde4 = SUB84((ulong)pSVar5 >> 0x20,0);
      in_stack_fffffffffffffdd8 =
           (SourceLocation)slang::ConstantValue::integer((ConstantValue *)0xa48baa);
      SVInt::operator>(in_stack_fffffffffffffdc8,(SVInt *)in_stack_fffffffffffffdc0);
      bVar1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffffdc0);
    }
  }
  if (bVar1 != false) {
    sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffde4.subsystem;
    sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffffde4.code;
    sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffde0;
    sourceRange_00.endLoc._0_5_ = in_stack_fffffffffffffde8;
    sourceRange_00.endLoc._5_1_ = in_stack_fffffffffffffded;
    sourceRange_00.endLoc._6_1_ = bVar1;
    sourceRange_00.endLoc._7_1_ = uVar2;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffdd8,code,sourceRange_00);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa48c88);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa48c95);
  return &pVVar3->super_Expression;
}

Assistant:

Expression& ValueRangeExpression::fromSyntax(Compilation& comp,
                                             const ValueRangeExpressionSyntax& syntax,
                                             const ASTContext& context) {
    ValueRangeKind rangeKind;
    switch (syntax.op.kind) {
        case TokenKind::PlusDivMinus:
            rangeKind = ValueRangeKind::AbsoluteTolerance;
            break;
        case TokenKind::PlusModMinus:
            rangeKind = ValueRangeKind::RelativeTolerance;
            break;
        default:
            rangeKind = ValueRangeKind::Simple;
            break;
    }

    // Unbounded literals are allowed if we are not a tolerance range.
    const auto flags = rangeKind == ValueRangeKind::Simple ? ASTFlags::AllowUnboundedLiteral
                                                           : ASTFlags::None;
    auto& left = create(comp, *syntax.left, context, flags);
    auto& right = create(comp, *syntax.right, context, flags);
    auto result = comp.emplace<ValueRangeExpression>(comp.getVoidType(), rangeKind, left, right,
                                                     syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;

    if (rangeKind == ValueRangeKind::Simple) {
        if (lt->isUnbounded()) {
            lt = &comp.getIntType();
            if (rt->isUnbounded())
                context.addDiag(diag::ValueRangeUnbounded, result->sourceRange);
        }

        if (rt->isUnbounded())
            rt = &comp.getIntType();

        if (!(lt->isNumeric() && rt->isNumeric()) &&
            !(left.isImplicitString() && right.isImplicitString())) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        auto cvl = context.tryEval(left);
        auto cvr = context.tryEval(right);
        if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
            context.addDiag(diag::ReversedValueRange, result->sourceRange);
    }
    else {
        if (!lt->isNumeric() || !rt->isNumeric()) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        selfDetermined(context, result->right_);
    }

    return *result;
}